

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSupMin.c
# Opt level: O2

Gia_ManSup_t * Gia_ManSupStart(int nVarsMax)

{
  undefined4 uVar1;
  void *pvVar2;
  Gia_ManSup_t *pGVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *pVVar5;
  uint *puVar6;
  ulong uVar7;
  int nCap;
  ulong uVar8;
  int nWords;
  int nWords_00;
  ulong uVar9;
  ulong uVar10;
  
  if (0x14 < nVarsMax) {
    __assert_fail("nVarsMax <= 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSupMin.c"
                  ,0x43,"Gia_ManSup_t *Gia_ManSupStart(int)");
  }
  pGVar3 = (Gia_ManSup_t *)calloc(1,0x48);
  pGVar3->nVarsMax = nVarsMax;
  uVar9 = (ulong)(uint)(1 << ((char)nVarsMax - 5U & 0x1f));
  if (nVarsMax < 6) {
    uVar9 = 1;
  }
  nWords_00 = (int)uVar9;
  pGVar3->nWordsMax = nWords_00;
  pVVar4 = Vec_PtrAllocSimInfo(nVarsMax,nWords_00);
  uVar7 = 0;
  uVar10 = (ulong)(uint)nVarsMax;
  if (nVarsMax < 1) {
    uVar10 = uVar7;
  }
  for (; uVar7 != uVar10; uVar7 = uVar7 + 1) {
    pvVar2 = pVVar4->pArray[uVar7];
    if (uVar7 < 5) {
      uVar1 = (&DAT_0080a050)[uVar7];
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar2 + uVar8 * 4) = uVar1;
      }
    }
    else {
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        *(uint *)((long)pvVar2 + uVar8 * 4) =
             -(uint)((1 << ((char)uVar7 - 5U & 0x1f) & (uint)uVar8) != 0);
      }
    }
  }
  pGVar3->vTruthVars = pVVar4;
  nCap = 0x200;
  pVVar4 = Vec_PtrAllocSimInfo(0x200,nWords_00);
  pGVar3->vTruthNodes = pVVar4;
  pVVar5 = Vec_IntAlloc(nCap);
  pGVar3->vConeCare = pVVar5;
  pVVar5 = Vec_IntAlloc(nCap);
  pGVar3->vConeData = pVVar5;
  puVar6 = (uint *)malloc(uVar9 << 2);
  pGVar3->pTruthIn = puVar6;
  puVar6 = (uint *)malloc(uVar9 << 2);
  pGVar3->pTruthOut = puVar6;
  return pGVar3;
}

Assistant:

Gia_ManSup_t * Gia_ManSupStart( int nVarsMax )
{
    Gia_ManSup_t * p;
    assert( nVarsMax <= 20 );
    p = ABC_CALLOC( Gia_ManSup_t, 1 );
    p->nVarsMax    = nVarsMax;
    p->nWordsMax   = Kit_TruthWordNum( p->nVarsMax );
    p->vTruthVars  = Vec_PtrAllocTruthTables( p->nVarsMax );
    p->vTruthNodes = Vec_PtrAllocSimInfo( 512, p->nWordsMax );
    p->vConeCare   = Vec_IntAlloc( 512 );
    p->vConeData   = Vec_IntAlloc( 512 );
    p->pTruthIn    = ABC_ALLOC( unsigned, p->nWordsMax );
    p->pTruthOut   = ABC_ALLOC( unsigned, p->nWordsMax );
    return p;
}